

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_vumeter.c
# Opt level: O0

void vu_check_height(t_vu *x,int h)

{
  int local_18;
  int n;
  int h_local;
  t_vu *x_local;
  
  local_18 = h / 0x28;
  if (local_18 < 2) {
    local_18 = 2;
  }
  x->x_led_size = local_18 + -1;
  (x->x_gui).x_h = local_18 * 0x28 * ((x->x_gui).x_glist)->gl_zoom;
  return;
}

Assistant:

void vu_check_height(t_vu *x, int h)
{
    int n;

    n = h / IEM_VU_STEPS;
    if(n < IEM_VU_MINSIZE)
        n = IEM_VU_MINSIZE;
    x->x_led_size = n - 1;
    x->x_gui.x_h = (IEM_VU_STEPS * n) * IEMGUI_ZOOM(x);
}